

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pipeline_prepare_finish_event.cpp
# Opt level: O0

void __thiscall
duckdb::PipelinePreFinishTask::PipelinePreFinishTask
          (PipelinePreFinishTask *this,Pipeline *pipeline_p,shared_ptr<duckdb::Event,_true> *event_p
          )

{
  shared_ptr<duckdb::Event,_true> *in_RDX;
  element_type *in_RSI;
  shared_ptr<duckdb::Event,_true> *in_RDI;
  shared_ptr<duckdb::Event,_true> *in_stack_ffffffffffffffd0;
  Executor *in_stack_ffffffffffffffd8;
  ExecutorTask *in_stack_ffffffffffffffe0;
  
  shared_ptr<duckdb::Event,_true>::shared_ptr(in_RDI,in_RDX);
  ExecutorTask::ExecutorTask
            (in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd0);
  shared_ptr<duckdb::Event,_true>::~shared_ptr((shared_ptr<duckdb::Event,_true> *)0x9c85a5);
  (in_RDI->internal).super___shared_ptr<duckdb::Event,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)&PTR__PipelinePreFinishTask_0350e828;
  in_RDI[5].internal.super___shared_ptr<duckdb::Event,_(__gnu_cxx::_Lock_policy)2>._M_ptr = in_RSI;
  return;
}

Assistant:

explicit PipelinePreFinishTask(Pipeline &pipeline_p, shared_ptr<Event> event_p)
	    : ExecutorTask(pipeline_p.executor, std::move(event_p)), pipeline(pipeline_p) {
	}